

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::truncate
          (ArrayBuilder<kj::Exception::Detail> *this,char *__file,__off_t __length)

{
  Detail *pDVar1;
  Detail *pDVar2;
  uchar *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pDVar1 = this->ptr;
  pDVar2 = this->pos;
  while (pDVar1 + (long)__file < pDVar2) {
    this->pos = pDVar2 + -1;
    puVar3 = pDVar2[-1].value.ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar4 = pDVar2[-1].value.size_;
      pDVar2[-1].value.ptr = (uchar *)0x0;
      pDVar2[-1].value.size_ = 0;
      pAVar5 = pDVar2[-1].value.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,1,sVar4,sVar4,0);
    }
    pDVar2 = this->pos;
  }
  return (int)pDVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }